

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O2

void __thiscall
cappuccino::
ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
           time_point expire_time)

{
  _List_iterator<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>
  _Var1;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>,_bool>
  pVar2;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>
  keyed_position;
  time_point expire_time_local;
  keyed_element element;
  
  element.m_value._M_dataplus._M_p = (pointer)&element.m_value.field_2;
  element.m_value._M_string_length = 0;
  element.m_value.field_2._M_local_buf[0] = '\0';
  element.m_ttl_position._M_node = (_List_node_base *)0x0;
  expire_time_local = expire_time;
  std::__cxx11::string::operator=((string *)&element,(string *)value);
  pVar2 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>>
          ::
          _M_emplace_unique<unsigned_long_const&,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>>
                      *)&this->m_keyed_elements,key,&element);
  keyed_position = pVar2.first._M_node;
  std::__cxx11::
  list<cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::ttl_element,std::allocator<cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::ttl_element>>
  ::
  emplace_back<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,std::_Rb_tree_iterator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>&>
            ((list<cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::ttl_element,std::allocator<cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::ttl_element>>
              *)&this->m_ttl_list,&expire_time_local,&keyed_position);
  _Var1 = std::
          prev<std::_List_iterator<cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::ttl_element>>
                    ((_List_iterator<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>
                      )&this->m_ttl_list,1);
  keyed_position._M_node[2]._M_parent = (_Base_ptr)_Var1._M_node;
  std::__cxx11::string::~string((string *)&element);
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time) -> void
    {
        keyed_element element;
        element.m_value = std::move(value);

        auto keyed_position = m_keyed_elements.emplace(key, std::move(element)).first;

        m_ttl_list.emplace_back(expire_time, keyed_position);

        // Update the elements iterator to ttl_element.
        keyed_position->second.m_ttl_position = std::prev(m_ttl_list.end());
    }